

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadStringFallback
          (CodedInputStream *this,string *buffer,int size)

{
  bool bVar1;
  int amount;
  ulong uVar2;
  int local_24;
  int current_buffer_size;
  int size_local;
  string *buffer_local;
  CodedInputStream *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  local_24 = size;
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::clear();
  }
  do {
    amount = BufferSize(this);
    if (local_24 <= amount) {
      std::__cxx11::string::append((char *)buffer,(ulong)this->buffer_);
      Advance(this,local_24);
      return true;
    }
    if (amount != 0) {
      std::__cxx11::string::append((char *)buffer,(ulong)this->buffer_);
    }
    local_24 = local_24 - amount;
    Advance(this,amount);
    bVar1 = Refresh(this);
  } while (bVar1);
  return false;
}

Assistant:

bool CodedInputStream::ReadStringFallback(string* buffer, int size) {
  if (!buffer->empty()) {
    buffer->clear();
  }

  int current_buffer_size;
  while ((current_buffer_size = BufferSize()) < size) {
    // Some STL implementations "helpfully" crash on buffer->append(NULL, 0).
    if (current_buffer_size != 0) {
      // Note:  string1.append(string2) is O(string2.size()) (as opposed to
      //   O(string1.size() + string2.size()), which would be bad).
      buffer->append(reinterpret_cast<const char*>(buffer_),
                     current_buffer_size);
    }
    size -= current_buffer_size;
    Advance(current_buffer_size);
    if (!Refresh()) return false;
  }

  buffer->append(reinterpret_cast<const char*>(buffer_), size);
  Advance(size);

  return true;
}